

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZRegisterClassId *in_RDI;
  TPZGeoMesh *in_stack_00000008;
  int in_stack_00000014;
  TPZVec<long> *in_stack_00000018;
  int64_t in_stack_00000020;
  void **in_stack_00000028;
  TPZGeoElRefLess<pzgeom::TPZQuadraticTrig> *in_stack_00000030;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZQuadraticTrig>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02467820);
  TPZGeoElRefLess<pzgeom::TPZQuadraticTrig>::TPZGeoElRefLess
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000014,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_024674f8;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_024674f8;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x120));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)in_RDI);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}